

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.c
# Opt level: O1

sysbvm_tuple_t
sysbvm_astUseNamedSlotsOfNode_primitiveAnalyze
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  _Bool _Var1;
  sysbvm_tuple_t sVar2;
  anon_struct_40_5_60240bed gcFrame;
  sysbvm_stackFrameSourcePositionRecord_t sourcePositionRecord;
  sysbvm_tuple_t local_88;
  sysbvm_tuple_t sStack_80;
  sysbvm_tuple_t local_78;
  sysbvm_tuple_t sStack_70;
  sysbvm_tuple_t local_68;
  sysbvm_stackFrameRecord_t local_60;
  undefined8 local_50;
  sysbvm_stackFrameRecord_t local_48;
  undefined8 local_38;
  undefined1 *puStack_30;
  
  if (argumentCount != 2) {
    sysbvm_error_argumentCountMismatch(2,argumentCount);
  }
  local_78 = 0;
  sStack_70 = 0;
  local_88 = 0;
  sStack_80 = 0;
  local_68 = 0;
  local_48.previous = (sysbvm_stackFrameRecord_s *)0x0;
  local_48.type = SYSBVM_STACK_FRAME_RECORD_TYPE_GC_ROOTS;
  local_48._12_4_ = 0;
  local_38 = 5;
  puStack_30 = (undefined1 *)&local_88;
  sysbvm_stackFrame_pushRecord(&local_48);
  local_88 = sysbvm_context_shallowCopy(context,*arguments);
  sVar2 = sysbvm_analysisAndEvaluationEnvironment_ensureValidAnalyzerToken(context,arguments[1]);
  *(sysbvm_tuple_t *)(local_88 + 0x18) = sVar2;
  *(sysbvm_tuple_t *)(local_88 + 0x20) = (context->roots).voidType;
  local_60.previous = (sysbvm_stackFrameRecord_s *)0x0;
  local_60.type = SYSBVM_STACK_FRAME_RECORD_TYPE_SOURCE_POSITION;
  local_50 = *(undefined8 *)(local_88 + 0x10);
  sysbvm_stackFrame_pushRecord(&local_60);
  sStack_80 = sysbvm_interpreter_analyzeASTWithExpectedTypeWithEnvironment
                        (context,*(sysbvm_tuple_t *)(local_88 + 0x28),
                         (context->roots).receiverTypeInferenceType,arguments[1]);
  *(sysbvm_tuple_t *)(local_88 + 0x28) = sStack_80;
  _Var1 = sysbvm_astNode_isLiteralNode(context,sStack_80);
  if (_Var1) {
    local_68 = sysbvm_astLiteralNode_getValue(sStack_80);
    local_78 = sysbvm_analysisEnvironment_setNewValueBinding
                         (context,arguments[1],*(sysbvm_tuple_t *)(local_88 + 0x10),0,local_68);
    sStack_70 = sysbvm_astLiteralNode_create(context,*(sysbvm_tuple_t *)(local_88 + 0x10),0x2f);
    sysbvm_analysisAndEvaluationEnvironment_addUseTupleWithNamedSlotsBinding
              (context,arguments[1],local_78);
  }
  else {
    if ((sStack_80 & 0xf) == 0 && sStack_80 != 0) {
      sVar2 = *(sysbvm_tuple_t *)(sStack_80 + 0x20);
    }
    else {
      sVar2 = 0;
    }
    local_78 = sysbvm_analysisEnvironment_setNewSymbolLocalBinding
                         (context,arguments[1],*(sysbvm_tuple_t *)(local_88 + 0x10),0,sVar2);
    sysbvm_analysisAndEvaluationEnvironment_addUseTupleWithNamedSlotsBinding
              (context,arguments[1],local_78);
    *(sysbvm_tuple_t *)(local_88 + 0x30) = local_78;
  }
  sysbvm_stackFrame_popRecord(&local_60);
  sysbvm_stackFrame_popRecord(&local_48);
  return local_88;
}

Assistant:

static sysbvm_tuple_t sysbvm_astUseNamedSlotsOfNode_primitiveAnalyze(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)closure;
    if(argumentCount != 2) sysbvm_error_argumentCountMismatch(2, argumentCount);

    sysbvm_tuple_t *node = &arguments[0];
    sysbvm_tuple_t *environment = &arguments[1];

    struct {
        sysbvm_astUseNamedSlotsOfNode_t *useNode;
        sysbvm_tuple_t analyzedTupleNode;
        sysbvm_tuple_t localBinding;
        sysbvm_tuple_t literalVoid;
        sysbvm_tuple_t value;
    } gcFrame = {0};
    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(gcFrameRecord, gcFrame);
    gcFrame.useNode = (sysbvm_astUseNamedSlotsOfNode_t*)sysbvm_context_shallowCopy(context, *node);
    gcFrame.useNode->super.analyzerToken = sysbvm_analysisAndEvaluationEnvironment_ensureValidAnalyzerToken(context, *environment);
    gcFrame.useNode->super.analyzedType = context->roots.voidType;
    SYSBVM_STACKFRAME_PUSH_SOURCE_POSITION(sourcePositionRecord, gcFrame.useNode->super.sourcePosition);

    gcFrame.analyzedTupleNode = sysbvm_interpreter_analyzeASTWithReceiverTypeWithEnvironment(context, gcFrame.useNode->tupleExpression, *environment);
    gcFrame.useNode->tupleExpression = gcFrame.analyzedTupleNode;

    if(sysbvm_astNode_isLiteralNode(context, gcFrame.analyzedTupleNode))
    {
        gcFrame.value = sysbvm_astLiteralNode_getValue(gcFrame.analyzedTupleNode);
        gcFrame.localBinding = sysbvm_analysisEnvironment_setNewValueBinding(context, *environment, gcFrame.useNode->super.sourcePosition, SYSBVM_NULL_TUPLE, gcFrame.value);
        gcFrame.literalVoid = sysbvm_astLiteralNode_create(context, gcFrame.useNode->super.sourcePosition, SYSBVM_VOID_TUPLE);
        sysbvm_analysisAndEvaluationEnvironment_addUseTupleWithNamedSlotsBinding(context, *environment, gcFrame.localBinding);

        SYSBVM_STACKFRAME_POP_SOURCE_POSITION(sourcePositionRecord);
        SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
        return (sysbvm_tuple_t)gcFrame.useNode;
    }
    else
    {
        gcFrame.localBinding = sysbvm_analysisEnvironment_setNewSymbolLocalBinding(context, *environment, gcFrame.useNode->super.sourcePosition, SYSBVM_NULL_TUPLE, sysbvm_astNode_getAnalyzedType(gcFrame.analyzedTupleNode));
        sysbvm_analysisAndEvaluationEnvironment_addUseTupleWithNamedSlotsBinding(context, *environment, gcFrame.localBinding);
        gcFrame.useNode->binding = gcFrame.localBinding;
    }

    SYSBVM_STACKFRAME_POP_SOURCE_POSITION(sourcePositionRecord);
    SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
    return (sysbvm_tuple_t)gcFrame.useNode;
}